

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx512::create_pipeline(Convolution1D_x86_avx512 *this,Option *opt)

{
  int _c;
  _func_int *p_Var1;
  _func_int **pp_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined4 *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint _h;
  undefined4 *puVar14;
  long lVar15;
  long lVar16;
  undefined4 *puVar17;
  int p;
  long lVar18;
  undefined4 *puVar19;
  undefined8 unaff_R14;
  long lVar20;
  ulong uVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Mat local_78;
  uint uVar22;
  uint uVar25;
  
  p_Var1 = this->_vptr_Convolution1D_x86_avx512[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var1) == 0) {
    _c = *(int *)(&this->field_0xd0 + (long)p_Var1);
    uVar12 = (long)*(int *)(&this->field_0xf0 + (long)p_Var1) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
    uVar12 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) / (long)_c;
    _h = (uint)uVar12;
    if (opt->use_packing_layout == true) {
      auVar23 = vpinsrd_avx(ZEXT416(_h),_c,1);
      auVar24._8_4_ = 7;
      auVar24._0_8_ = 0x700000007;
      auVar24._12_4_ = 7;
      uVar13 = vptestnmd_avx512vl(auVar23,auVar24);
      auVar10._8_4_ = 3;
      auVar10._0_8_ = 0x300000003;
      auVar10._12_4_ = 3;
      uVar21 = vptestnmd_avx512vl(auVar23,auVar10);
      auVar23 = vpbroadcastd_avx512vl(ZEXT416(4));
      bVar7 = (bool)((byte)(uVar21 & 0xf) & 1);
      bVar9 = (bool)((byte)((uVar21 & 0xf) >> 1) & 1);
      auVar24 = vpbroadcastd_avx512vl(ZEXT416(8));
      bVar8 = (bool)((byte)(uVar13 & 0xf) & 1);
      uVar22 = (uint)bVar8 * auVar24._0_4_ |
               (uint)!bVar8 * ((uint)bVar7 * auVar23._0_4_ | (uint)!bVar7);
      bVar7 = (bool)((byte)((uVar13 & 0xf) >> 1) & 1);
      uVar25 = (uint)bVar7 * auVar24._4_4_ |
               (uint)!bVar7 * ((uint)bVar9 * auVar23._4_4_ | (uint)!bVar9);
    }
    else {
      uVar22 = 1;
      uVar25 = 1;
    }
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var1),
                 *(int *)(&this->field_0xd4 + (long)p_Var1),_h,_c,(Allocator *)0x0);
    lVar20 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar22);
    uVar13 = (ulong)uVar25;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx512[-3]),
                (int)((long)((ulong)(uint)((int)_h >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
                     (long)(int)uVar22),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]) /
                (int)uVar25,lVar20 * uVar13 * 4,uVar25 * uVar22,(Allocator *)0x0);
    pp_Var2 = this->_vptr_Convolution1D_x86_avx512;
    pvVar3 = (this->weight_data_packed).data;
    sVar4 = (this->weight_data_packed).cstep;
    sVar5 = (this->weight_data_packed).elemsize;
    for (uVar12 = 0;
        (long)((uVar25 - 1) + uVar12) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        uVar12 = uVar12 + uVar13) {
      puVar11 = (undefined4 *)
                ((long)(int)((uVar12 & 0xffffffff) / uVar13) * sVar4 * sVar5 + (long)pvVar3);
      pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
      for (lVar18 = 0; lVar18 < (long)((long)(int)_h - (ulong)(uVar22 - 1));
          lVar18 = lVar18 + lVar20) {
        puVar17 = (undefined4 *)
                  ((local_78.w * lVar18 + uVar12 * local_78.cstep) * local_78.elemsize +
                  (long)local_78.data);
        for (lVar16 = 0; lVar16 < *(int *)(&this->field_0xd4 + (long)pp_Var6[-3]);
            lVar16 = lVar16 + 1) {
          puVar14 = puVar17;
          for (lVar15 = 0; puVar19 = puVar14, uVar21 = uVar13, lVar15 != lVar20; lVar15 = lVar15 + 1
              ) {
            while (uVar21 != 0) {
              *puVar11 = *puVar19;
              puVar11 = puVar11 + 1;
              puVar19 = (undefined4 *)((long)puVar19 + local_78.cstep * local_78.elemsize);
              uVar21 = uVar21 - 1;
            }
            puVar14 = (undefined4 *)((long)puVar14 + local_78.elemsize * (long)local_78.w);
          }
          puVar17 = puVar17 + 1;
        }
      }
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}